

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Definition * __thiscall cppforth::Forth::definitionsAt(Forth *this,Cell index)

{
  size_type sVar1;
  reference pvVar2;
  allocator<char> local_39;
  string local_38;
  Cell local_14;
  Forth *pFStack_10;
  Cell index_local;
  Forth *this_local;
  
  local_14 = index;
  pFStack_10 = this;
  sVar1 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  if (sVar1 <= index) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Access to definitions out of range",&local_39);
    throwCppExceptionMessage(this,&local_38,errorUndefinedWord);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  pvVar2 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
           at(&this->definitions,(ulong)local_14);
  return pvVar2;
}

Assistant:

Definition &definitionsAt(Cell index){
			if (index >= definitions.size() || index<0){
				throwCppExceptionMessage("Access to definitions out of range",errorUndefinedWord);
			}
			return definitions.at(index);
		}